

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_comp.cpp
# Opt level: O1

void __thiscall crnlib::crn_comp::clear(crn_comp *this)

{
  undefined8 *puVar1;
  void *pvVar2;
  level_details *p;
  uint *puVar3;
  unsigned_long_long *p_00;
  endpoint_indices_details *p_01;
  selector_indices_details *p_02;
  uchar *puVar4;
  long lVar5;
  pixel_buf_t *ppVar6;
  static_huffman_data_model *this_00;
  long lVar7;
  
  this->m_pParams = (crn_comp_params *)0x0;
  ppVar6 = &this->m_images[0][0].m_pixel_buf;
  lVar7 = 0;
  do {
    lVar5 = 0;
    do {
      *(undefined8 *)((long)ppVar6 + lVar5 + -8) = 0;
      pvVar2 = *(void **)((long)&ppVar6->m_p + lVar5);
      if (pvVar2 != (void *)0x0) {
        puVar1 = (undefined8 *)((long)&ppVar6->m_p + lVar5);
        crnlib_free(pvVar2);
        *puVar1 = 0;
        puVar1[1] = 0;
      }
      *(undefined8 *)((long)&((image_u8 *)(ppVar6 + -2))->m_width + lVar5) = 0;
      *(undefined8 *)((long)ppVar6 + lVar5 + -0x18) = 0;
      *(undefined4 *)((long)(ppVar6 + -1) + lVar5) = 0xf;
      lVar5 = lVar5 + 0x30;
    } while (lVar5 != 0x300);
    lVar7 = lVar7 + 1;
    ppVar6 = ppVar6 + 0x30;
  } while (lVar7 != 6);
  this->m_has_subblocks = false;
  this->m_has_comp[0] = false;
  this->m_has_comp[1] = false;
  this->m_has_comp[2] = false;
  this->m_has_etc_color_blocks = false;
  p = (this->m_levels).m_p;
  if (p != (level_details *)0x0) {
    crnlib_free(p);
    (this->m_levels).m_p = (level_details *)0x0;
    (this->m_levels).m_size = 0;
    (this->m_levels).m_capacity = 0;
  }
  this->m_total_blocks = 0;
  puVar3 = (this->m_color_endpoints).m_p;
  if (puVar3 != (uint *)0x0) {
    crnlib_free(puVar3);
    (this->m_color_endpoints).m_p = (uint *)0x0;
    (this->m_color_endpoints).m_size = 0;
    (this->m_color_endpoints).m_capacity = 0;
  }
  puVar3 = (this->m_alpha_endpoints).m_p;
  if (puVar3 != (uint *)0x0) {
    crnlib_free(puVar3);
    (this->m_alpha_endpoints).m_p = (uint *)0x0;
    (this->m_alpha_endpoints).m_size = 0;
    (this->m_alpha_endpoints).m_capacity = 0;
  }
  puVar3 = (this->m_color_selectors).m_p;
  if (puVar3 != (uint *)0x0) {
    crnlib_free(puVar3);
    (this->m_color_selectors).m_p = (uint *)0x0;
    (this->m_color_selectors).m_size = 0;
    (this->m_color_selectors).m_capacity = 0;
  }
  p_00 = (this->m_alpha_selectors).m_p;
  if (p_00 != (unsigned_long_long *)0x0) {
    crnlib_free(p_00);
    (this->m_alpha_selectors).m_p = (unsigned_long_long *)0x0;
    (this->m_alpha_selectors).m_size = 0;
    (this->m_alpha_selectors).m_capacity = 0;
  }
  p_01 = (this->m_endpoint_indices).m_p;
  if (p_01 != (endpoint_indices_details *)0x0) {
    crnlib_free(p_01);
    (this->m_endpoint_indices).m_p = (endpoint_indices_details *)0x0;
    (this->m_endpoint_indices).m_size = 0;
    (this->m_endpoint_indices).m_capacity = 0;
  }
  p_02 = (this->m_selector_indices).m_p;
  if (p_02 != (selector_indices_details *)0x0) {
    crnlib_free(p_02);
    (this->m_selector_indices).m_p = (selector_indices_details *)0x0;
    (this->m_selector_indices).m_size = 0;
    (this->m_selector_indices).m_capacity = 0;
  }
  *(undefined8 *)((this->m_crn_header).m_alpha_selectors.m_ofs.m_buf + 1) = 0;
  *(undefined8 *)((this->m_crn_header).m_tables_size.m_buf + 1) = 0;
  *(undefined8 *)((this->m_crn_header).m_color_selectors.m_num.m_buf + 1) = 0;
  *(undefined8 *)((this->m_crn_header).m_alpha_endpoints.m_num.m_buf + 1) = 0;
  *(undefined8 *)((this->m_crn_header).m_userdata1.m_buf + 3) = 0;
  *(undefined8 *)((this->m_crn_header).m_color_endpoints.m_num.m_buf + 1) = 0;
  (this->m_crn_header).m_levels = (uchar  [1])0x0;
  (this->m_crn_header).m_faces = (uchar  [1])0x0;
  (this->m_crn_header).m_format = (uchar  [1])0x0;
  (this->m_crn_header).m_flags = (uchar  [2])0x0;
  (this->m_crn_header).m_reserved.m_buf[0] = '\0';
  (this->m_crn_header).m_reserved.m_buf[1] = '\0';
  (this->m_crn_header).m_reserved.m_buf[2] = '\0';
  *(undefined8 *)((this->m_crn_header).m_reserved.m_buf + 3) = 0;
  (this->m_crn_header).m_sig = (uchar  [2])0x0;
  (this->m_crn_header).m_header_size = (uchar  [2])0x0;
  (this->m_crn_header).m_header_crc16 = (uchar  [2])0x0;
  (this->m_crn_header).m_data_size.m_buf[0] = '\0';
  (this->m_crn_header).m_data_size.m_buf[1] = '\0';
  *(undefined8 *)((this->m_crn_header).m_data_size.m_buf + 2) = 0;
  puVar4 = (this->m_comp_data).m_p;
  if (puVar4 != (uchar *)0x0) {
    crnlib_free(puVar4);
    (this->m_comp_data).m_p = (uchar *)0x0;
    (this->m_comp_data).m_size = 0;
    (this->m_comp_data).m_capacity = 0;
  }
  dxt_hc::clear(&this->m_hvq);
  puVar3 = (this->m_reference_hist).m_hist.m_p;
  if (puVar3 != (uint *)0x0) {
    crnlib_free(puVar3);
    (this->m_reference_hist).m_hist.m_p = (uint *)0x0;
    (this->m_reference_hist).m_hist.m_size = 0;
    (this->m_reference_hist).m_hist.m_capacity = 0;
  }
  static_huffman_data_model::clear(&this->m_reference_dm);
  this_00 = (static_huffman_data_model *)&this->field_0x2690;
  lVar7 = 0;
  do {
    pvVar2 = *(void **)((long)&this->m_endpoint_remaping[0].m_p + lVar7);
    if (pvVar2 != (void *)0x0) {
      crnlib_free(pvVar2);
      *(undefined8 *)((long)&this->m_endpoint_remaping[0].m_p + lVar7) = 0;
      *(undefined8 *)((long)&this->m_endpoint_remaping[0].m_size + lVar7) = 0;
    }
    pvVar2 = *(void **)((long)&this->m_endpoint_index_hist[0].m_hist.m_p + lVar7);
    if (pvVar2 != (void *)0x0) {
      crnlib_free(pvVar2);
      *(undefined8 *)((long)&this->m_endpoint_index_hist[0].m_hist.m_p + lVar7) = 0;
      *(undefined8 *)((long)&this->m_endpoint_index_hist[0].m_hist.m_size + lVar7) = 0;
    }
    static_huffman_data_model::clear(this_00);
    pvVar2 = *(void **)((long)&this->m_selector_remaping[0].m_p + lVar7);
    if (pvVar2 != (void *)0x0) {
      crnlib_free(pvVar2);
      *(undefined8 *)((long)&this->m_selector_remaping[0].m_p + lVar7) = 0;
      *(undefined8 *)((long)&this->m_selector_remaping[0].m_size + lVar7) = 0;
    }
    pvVar2 = *(void **)((long)&this->m_selector_index_hist[0].m_hist.m_p + lVar7);
    if (pvVar2 != (void *)0x0) {
      puVar1 = (undefined8 *)((long)&this->m_selector_index_hist[0].m_hist.m_p + lVar7);
      crnlib_free(pvVar2);
      *puVar1 = 0;
      puVar1[1] = 0;
    }
    static_huffman_data_model::clear((static_huffman_data_model *)&this_00[3].m_codes);
    lVar7 = lVar7 + 0x10;
    this_00 = this_00 + 1;
  } while (lVar7 == 0x10);
  lVar7 = 0;
  do {
    pvVar2 = *(void **)((long)&this->m_packed_blocks[0].m_p + lVar7);
    if (pvVar2 != (void *)0x0) {
      puVar1 = (undefined8 *)((long)&this->m_packed_blocks[0].m_p + lVar7);
      crnlib_free(pvVar2);
      *puVar1 = 0;
      puVar1[1] = 0;
    }
    lVar7 = lVar7 + 0x10;
  } while (lVar7 != 0x100);
  puVar4 = (this->m_packed_data_models).m_p;
  if (puVar4 != (uchar *)0x0) {
    crnlib_free(puVar4);
    (this->m_packed_data_models).m_p = (uchar *)0x0;
    (this->m_packed_data_models).m_size = 0;
    (this->m_packed_data_models).m_capacity = 0;
  }
  puVar4 = (this->m_packed_color_endpoints).m_p;
  if (puVar4 != (uchar *)0x0) {
    crnlib_free(puVar4);
    (this->m_packed_color_endpoints).m_p = (uchar *)0x0;
    (this->m_packed_color_endpoints).m_size = 0;
    (this->m_packed_color_endpoints).m_capacity = 0;
  }
  puVar4 = (this->m_packed_color_selectors).m_p;
  if (puVar4 != (uchar *)0x0) {
    crnlib_free(puVar4);
    (this->m_packed_color_selectors).m_p = (uchar *)0x0;
    (this->m_packed_color_selectors).m_size = 0;
    (this->m_packed_color_selectors).m_capacity = 0;
  }
  puVar4 = (this->m_packed_alpha_endpoints).m_p;
  if (puVar4 != (uchar *)0x0) {
    crnlib_free(puVar4);
    (this->m_packed_alpha_endpoints).m_p = (uchar *)0x0;
    (this->m_packed_alpha_endpoints).m_size = 0;
    (this->m_packed_alpha_endpoints).m_capacity = 0;
  }
  puVar4 = (this->m_packed_alpha_selectors).m_p;
  if (puVar4 != (uchar *)0x0) {
    crnlib_free(puVar4);
    (this->m_packed_alpha_selectors).m_p = (uchar *)0x0;
    (this->m_packed_alpha_selectors).m_size = 0;
    (this->m_packed_alpha_selectors).m_capacity = 0;
  }
  return;
}

Assistant:

void crn_comp::clear() {
  m_pParams = NULL;

  for (uint f = 0; f < cCRNMaxFaces; f++)
    for (uint l = 0; l < cCRNMaxLevels; l++)
      m_images[f][l].clear();

  utils::zero_object(m_has_comp);
  m_has_etc_color_blocks = false;
  m_has_subblocks = false;

  m_levels.clear();

  m_total_blocks = 0;
  m_color_endpoints.clear();
  m_alpha_endpoints.clear();
  m_color_selectors.clear();
  m_alpha_selectors.clear();
  m_endpoint_indices.clear();
  m_selector_indices.clear();

  utils::zero_object(m_crn_header);

  m_comp_data.clear();

  m_hvq.clear();

  m_reference_hist.clear();
  m_reference_dm.clear();
  for (uint i = 0; i < 2; i++) {
    m_endpoint_remaping[i].clear();
    m_endpoint_index_hist[i].clear();
    m_endpoint_index_dm[i].clear();
    m_selector_remaping[i].clear();
    m_selector_index_hist[i].clear();
    m_selector_index_dm[i].clear();
  }

  for (uint i = 0; i < cCRNMaxLevels; i++)
    m_packed_blocks[i].clear();

  m_packed_data_models.clear();

  m_packed_color_endpoints.clear();
  m_packed_color_selectors.clear();
  m_packed_alpha_endpoints.clear();
  m_packed_alpha_selectors.clear();
}